

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O1

uint __thiscall Future<void>::Private::ThreadPool::ThreadContext::proc(ThreadContext *this)

{
  usize *puVar1;
  usize uVar2;
  ThreadPool *pTVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  _func_void_void_ptr *unaff_RBP;
  Node *pNVar7;
  ulong uVar8;
  void *unaff_R12;
  bool bVar9;
  
  pTVar3 = this->_pool;
LAB_00106e4a:
  do {
    uVar6 = (pTVar3->_queue)._head;
    do {
      uVar5 = uVar6;
      pNVar7 = (pTVar3->_queue)._queue;
      uVar8 = (pTVar3->_queue)._capacityMask & uVar5;
      uVar4 = pNVar7[uVar8].head;
      if (uVar4 != uVar5) goto LAB_00106e94;
      puVar1 = &(pTVar3->_queue)._head;
      LOCK();
      uVar6 = *puVar1;
      bVar9 = uVar5 == uVar6;
      if (bVar9) {
        *puVar1 = uVar5 + 1;
        uVar6 = uVar5;
      }
      UNLOCK();
    } while (!bVar9);
    pNVar7 = pNVar7 + uVar8;
    unaff_RBP = (pNVar7->data).proc;
    unaff_R12 = (pNVar7->data).args;
    LOCK();
    pNVar7->tail = (pTVar3->_queue)._capacity + uVar5;
    UNLOCK();
LAB_00106e94:
    if (uVar4 != uVar5) {
      LOCK();
      puVar1 = &(pTVar3->_enqueuedSignal)._state;
      uVar2 = *puVar1;
      *puVar1 = 0;
      UNLOCK();
      if (uVar2 == 1) {
        Signal::reset(&(pTVar3->_enqueuedSignal)._signal);
      }
      uVar6 = (pTVar3->_queue)._head;
      do {
        uVar5 = uVar6;
        pNVar7 = (pTVar3->_queue)._queue;
        uVar8 = (pTVar3->_queue)._capacityMask & uVar5;
        uVar4 = pNVar7[uVar8].head;
        if (uVar4 != uVar5) goto LAB_00106efa;
        puVar1 = &(pTVar3->_queue)._head;
        LOCK();
        uVar6 = *puVar1;
        bVar9 = uVar5 == uVar6;
        if (bVar9) {
          *puVar1 = uVar5 + 1;
          uVar6 = uVar5;
        }
        UNLOCK();
      } while (!bVar9);
      pNVar7 = pNVar7 + uVar8;
      unaff_RBP = (pNVar7->data).proc;
      unaff_R12 = (pNVar7->data).args;
      LOCK();
      pNVar7->tail = (pTVar3->_queue)._capacity + uVar5;
      UNLOCK();
LAB_00106efa:
      if (uVar4 != uVar5) {
        if ((pTVar3->_enqueuedSignal)._state == 0) {
          Signal::wait(&(pTVar3->_enqueuedSignal)._signal,pNVar7);
        }
        goto LAB_00106e4a;
      }
    }
    LOCK();
    puVar1 = &(pTVar3->_dequeuedSignal)._state;
    uVar2 = *puVar1;
    *puVar1 = 1;
    UNLOCK();
    if (uVar2 == 0) {
      Signal::set(&(pTVar3->_dequeuedSignal)._signal);
    }
    if (unaff_RBP == (_func_void_void_ptr *)0x0) {
      this->_terminated = true;
      return 0;
    }
    (*unaff_RBP)(unaff_R12);
    LOCK();
    puVar1 = &this->_pool->_processedJobs;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
  } while( true );
}

Assistant:

uint proc()
      {
        Job job;
        LockFreeQueue<Job> &queue = _pool->_queue;
        FastSignal &enqueuedSignal = _pool->_enqueuedSignal;
        FastSignal &dequeuedSignal = _pool->_dequeuedSignal;
        for (;;)
        {
          while (!queue.pop(job))
          {
            enqueuedSignal.reset();
            if (queue.pop(job))
              break;
            enqueuedSignal.wait();
          }
          dequeuedSignal.set();
          if (job.proc)
          {
            job.proc(job.args);
            Atomic::increment(_pool->_processedJobs);
          }
          else
            break;
        }
        _terminated = true;
        return 0;
      }